

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

string * namingConventions::findClassName(string *__return_storage_ptr__,string *word)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar1 = 0;
      ((ulong)uVar1 < word->_M_string_length && ((word->_M_dataplus)._M_p[uVar1] != '{'));
      uVar1 = uVar1 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::findClassName(std::string &word) {
    std::string name;
    for (unsigned int c = 0; c < word.size(); ++c) {
        if (word[c] != '{') {
            name.push_back(word[c]);
        } else {
            return name;
        }
    }
    return name;
}